

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_resampler_config *
ma_resampler_config_init
          (ma_format format,ma_uint32 channels,ma_uint32 sampleRateIn,ma_uint32 sampleRateOut,
          ma_resample_algorithm algorithm)

{
  ma_uint32 in_ECX;
  ma_uint32 in_EDX;
  ma_format in_ESI;
  ma_resampler_config *in_RDI;
  ma_uint32 in_R8D;
  ma_resample_algorithm in_R9D;
  
  if (in_RDI != (ma_resampler_config *)0x0) {
    memset(in_RDI,0,0x30);
  }
  in_RDI->format = in_ESI;
  in_RDI->channels = in_EDX;
  in_RDI->sampleRateIn = in_ECX;
  in_RDI->sampleRateOut = in_R8D;
  in_RDI->algorithm = in_R9D;
  (in_RDI->linear).lpfOrder = 4;
  return in_RDI;
}

Assistant:

MA_API ma_resampler_config ma_resampler_config_init(ma_format format, ma_uint32 channels, ma_uint32 sampleRateIn, ma_uint32 sampleRateOut, ma_resample_algorithm algorithm)
{
    ma_resampler_config config;

    MA_ZERO_OBJECT(&config);
    config.format = format;
    config.channels = channels;
    config.sampleRateIn = sampleRateIn;
    config.sampleRateOut = sampleRateOut;
    config.algorithm = algorithm;

    /* Linear. */
    config.linear.lpfOrder = ma_min(MA_DEFAULT_RESAMPLER_LPF_ORDER, MA_MAX_FILTER_ORDER);

    return config;
}